

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.h
# Opt level: O0

void __thiscall wasm::TryTable::TryTable(TryTable *this,MixedArena *allocator)

{
  MixedArena *allocator_local;
  TryTable *this_local;
  
  SpecificExpression<(wasm::Expression::Id)53>::SpecificExpression
            (&this->super_SpecificExpression<(wasm::Expression::Id)53>);
  ArenaVector<wasm::Name>::ArenaVector(&this->catchTags,allocator);
  ArenaVector<wasm::Name>::ArenaVector(&this->catchDests,allocator);
  ArenaVector<bool>::ArenaVector(&this->catchRefs,allocator);
  ArenaVector<wasm::Type>::ArenaVector(&this->sentTypes,allocator);
  return;
}

Assistant:

TryTable(MixedArena& allocator)
    : catchTags(allocator), catchDests(allocator), catchRefs(allocator),
      sentTypes(allocator) {}